

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void freeCursorConstraints(RtreeCursor *pCsr)

{
  void *p;
  long lVar1;
  long lVar2;
  
  if (pCsr->aConstraint != (RtreeConstraint *)0x0) {
    if (0 < pCsr->nConstraint) {
      lVar2 = 0x10;
      lVar1 = 0;
      do {
        p = *(void **)((long)&pCsr->aConstraint->iCoord + lVar2);
        if (p != (void *)0x0) {
          if (*(code **)((long)p + 0x20) != (code *)0x0) {
            (**(code **)((long)p + 0x20))(*(undefined8 *)((long)p + 0x18));
          }
          sqlite3_free(p);
        }
        lVar1 = lVar1 + 1;
        lVar2 = lVar2 + 0x18;
      } while (lVar1 < pCsr->nConstraint);
    }
    sqlite3_free(pCsr->aConstraint);
    pCsr->aConstraint = (RtreeConstraint *)0x0;
  }
  return;
}

Assistant:

static void freeCursorConstraints(RtreeCursor *pCsr){
  if( pCsr->aConstraint ){
    int i;                        /* Used to iterate through constraint array */
    for(i=0; i<pCsr->nConstraint; i++){
      sqlite3_rtree_query_info *pInfo = pCsr->aConstraint[i].pInfo;
      if( pInfo ){
        if( pInfo->xDelUser ) pInfo->xDelUser(pInfo->pUser);
        sqlite3_free(pInfo);
      }
    }
    sqlite3_free(pCsr->aConstraint);
    pCsr->aConstraint = 0;
  }
}